

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
cppqc::shrinkIntegral<unsigned_long>(unsigned_long x)

{
  ulong in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  unsigned_long n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  undefined8 local_20;
  
  this = in_RDI;
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3f7014);
  for (local_20 = in_RSI; local_20 != 0; local_20 = local_20 >> 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this,(value_type_conflict1 *)in_RDI);
  }
  return this;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}